

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void AYUVToUVRow_C(uint8_t *src_ayuv,int src_stride_ayuv,uint8_t *dst_uv,int width)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = (long)src_stride_ayuv;
  if (0 < width) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      dst_uv[lVar3] =
           (uint8_t)((uint)src_ayuv[lVar3 * 4 + lVar1 + 1] +
                     (uint)src_ayuv[lVar3 * 4 + 5] + (uint)src_ayuv[lVar3 * 4 + 1] +
                     (uint)src_ayuv[lVar3 * 4 + lVar1 + 5] + 2 >> 2);
      dst_uv[lVar3 + 1] =
           (uint8_t)((uint)src_ayuv[lVar3 * 4 + lVar1] +
                     (uint)src_ayuv[lVar3 * 4 + 4] + (uint)src_ayuv[lVar3 * 4] +
                     (uint)src_ayuv[lVar3 * 4 + (long)(src_stride_ayuv + 4)] + 2 >> 2);
      lVar3 = lVar3 + 2;
      lVar2 = lVar2 + 8;
    } while ((int)lVar3 < width);
    src_ayuv = src_ayuv + lVar2;
    dst_uv = dst_uv + lVar3;
  }
  if ((width & 1U) != 0) {
    *dst_uv = (uint8_t)(((uint)src_ayuv[lVar1] + (uint)*src_ayuv) * 2 + 2 >> 2);
    dst_uv[1] = (uint8_t)(((uint)src_ayuv[lVar1 + 1] + (uint)src_ayuv[1]) * 2 + 2 >> 2);
  }
  return;
}

Assistant:

void AYUVToUVRow_C(const uint8_t* src_ayuv,
                   int src_stride_ayuv,
                   uint8_t* dst_uv,
                   int width) {
  // Output a row of UV values, filtering 2x2 rows of AYUV.
  int x;
  for (x = 0; x < width; x += 2) {
    dst_uv[0] = (src_ayuv[1] + src_ayuv[5] + src_ayuv[src_stride_ayuv + 1] +
                 src_ayuv[src_stride_ayuv + 5] + 2) >>
                2;
    dst_uv[1] = (src_ayuv[0] + src_ayuv[4] + src_ayuv[src_stride_ayuv + 0] +
                 src_ayuv[src_stride_ayuv + 4] + 2) >>
                2;
    src_ayuv += 8;
    dst_uv += 2;
  }
  if (width & 1) {
    dst_uv[0] = (src_ayuv[0] + src_ayuv[0] + src_ayuv[src_stride_ayuv + 0] +
                 src_ayuv[src_stride_ayuv + 0] + 2) >>
                2;
    dst_uv[1] = (src_ayuv[1] + src_ayuv[1] + src_ayuv[src_stride_ayuv + 1] +
                 src_ayuv[src_stride_ayuv + 1] + 2) >>
                2;
  }
}